

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O1

bool __thiscall Datetime::parse_date_time(Datetime *this,Pig *pig)

{
  bool bVar1;
  size_type previous;
  
  previous = Pig::cursor(pig);
  bVar1 = parse_date(this,pig);
  if ((bVar1) && (bVar1 = Pig::skip(pig,0x54), bVar1)) {
    bVar1 = parse_time_utc(this,pig);
    if (bVar1) {
      return true;
    }
    bVar1 = parse_time_off(this,pig);
    if (bVar1) {
      return true;
    }
    bVar1 = parse_time(this,pig,true);
    if (bVar1) {
      return true;
    }
  }
  Pig::restoreTo(pig,previous);
  return false;
}

Assistant:

bool Datetime::parse_date_time (Pig& pig)
{
  auto checkpoint = pig.cursor ();

  if (parse_date (pig) &&
      pig.skip ('T')   &&
      (parse_time_utc (pig) ||
       parse_time_off (pig) ||
       parse_time     (pig)))
  {
    return true;
  }

  pig.restoreTo (checkpoint);
  return false;
}